

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

vector<void_*,_std::allocator<void_*>_> *
eglu::chooseConfigs(vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Library *egl,
                   EGLDisplay display,EGLint *attribList)

{
  EGLint *pEVar1;
  EGLint *pEVar2;
  EGLDisplay pvVar3;
  deUint32 dVar4;
  deBool dVar5;
  size_type __n;
  reference ppvVar6;
  allocator<void_*> local_2e;
  undefined1 local_2d;
  int local_2c;
  EGLint *pEStack_28;
  EGLint numConfigs;
  EGLint *attribList_local;
  EGLDisplay display_local;
  Library *egl_local;
  vector<void_*,_std::allocator<void_*>_> *configs;
  
  local_2c = 0;
  pEStack_28 = attribList;
  attribList_local = (EGLint *)display;
  display_local = egl;
  egl_local = (Library *)__return_storage_ptr__;
  do {
    (**(code **)(*display_local + 0x10))(display_local,attribList_local,pEStack_28,0,0,&local_2c);
    dVar4 = (**(code **)(*display_local + 0xf8))();
    checkError(dVar4,"chooseConfig(display, attribList, DE_NULL, 0, &numConfigs)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x75);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  local_2d = 0;
  __n = (size_type)local_2c;
  std::allocator<void_*>::allocator(&local_2e);
  std::vector<void_*,_std::allocator<void_*>_>::vector(__return_storage_ptr__,__n,&local_2e);
  std::allocator<void_*>::~allocator(&local_2e);
  if (0 < local_2c) {
    do {
      pvVar3 = display_local;
      pEVar2 = attribList_local;
      pEVar1 = pEStack_28;
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::front(__return_storage_ptr__);
      (**(code **)(*pvVar3 + 0x10))(pvVar3,pEVar2,pEVar1,ppvVar6,local_2c,&local_2c);
      dVar4 = (**(code **)(*display_local + 0xf8))();
      checkError(dVar4,
                 "chooseConfig(display, attribList, &configs.front(), numConfigs, &numConfigs)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x7b);
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLConfig> chooseConfigs (const Library& egl, EGLDisplay display, const EGLint* attribList)
{
	EGLint	numConfigs	= 0;

	EGLU_CHECK_CALL(egl, chooseConfig(display, attribList, DE_NULL, 0, &numConfigs));

	{
		vector<EGLConfig> configs(numConfigs);

		if (numConfigs > 0)
			EGLU_CHECK_CALL(egl, chooseConfig(display, attribList, &configs.front(), numConfigs, &numConfigs));

		return configs;
	}
}